

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

void __thiscall soplex::SPxDevexPR<double>::setType(SPxDevexPR<double> *this,Type tp)

{
  setupWeights(this,tp);
  this->refined = false;
  (this->bestPrices).super_IdxSet.num = 0;
  DIdxSet::setMax(&this->bestPrices,
                  (((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
  std::
  vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ::resize(&(this->prices).data,
           (long)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
  if (tp != ENTER) {
    return;
  }
  (this->bestPricesCo).super_IdxSet.num = 0;
  DIdxSet::setMax(&this->bestPricesCo,
                  (((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum);
  std::
  vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
  ::resize(&(this->pricesCo).data,
           (long)(((this->super_SPxPricer<double>).thesolver)->thevectors->set).thenum);
  return;
}

Assistant:

void SPxDevexPR<R>::setType(typename SPxSolverBase<R>::Type tp)
{
   setupWeights(tp);
   refined = false;

   bestPrices.clear();
   bestPrices.setMax(this->thesolver->dim());
   prices.reSize(this->thesolver->dim());

   if(tp == SPxSolverBase<R>::ENTER)
   {
      bestPricesCo.clear();
      bestPricesCo.setMax(this->thesolver->coDim());
      pricesCo.reSize(this->thesolver->coDim());
   }

   assert(isConsistent());
}